

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O2

InfoStatus
checkInfo(HighsLogOptions *report_log_options,
         vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *info_records)

{
  HighsInfoType HVar1;
  InfoRecord *pIVar2;
  _func_int **pp_Var3;
  InfoRecord *pIVar4;
  __type _Var5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  HighsInt check_index;
  InfoStatus IVar9;
  ulong uVar10;
  ulong uVar11;
  string name;
  string check_name;
  
  uVar6 = (ulong)((long)(info_records->
                        super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(info_records->
                       super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  uVar7 = 0;
  if (0 < (int)uVar6) {
    uVar7 = uVar6 & 0xffffffff;
  }
  uVar6 = uVar6 & 0xffffffff;
  bVar8 = false;
  for (uVar11 = 0; uVar11 != uVar7; uVar11 = uVar11 + 1) {
    std::__cxx11::string::string
              ((string *)&name,
               (string *)
               &(info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar11]->name);
    HVar1 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar11]->type;
    for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
      if (uVar11 != uVar10) {
        std::__cxx11::string::string
                  ((string *)&check_name,
                   (string *)
                   &(info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar10]->name);
        _Var5 = std::operator==(&check_name,&name);
        if (_Var5) {
          bVar8 = true;
          highsLogUser(report_log_options,kError,
                       "checkInfo: Info %d (\"%s\") has the same name as info %d \"%s\"\n",
                       uVar11 & 0xffffffff,name._M_dataplus._M_p,uVar10 & 0xffffffff,
                       check_name._M_dataplus._M_p);
        }
        std::__cxx11::string::~string((string *)&check_name);
      }
    }
    if (HVar1 == kInt64) {
      pIVar2 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar11];
      pp_Var3 = pIVar2[1]._vptr_InfoRecord;
      for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
        if (((uVar11 != uVar10) &&
            (pIVar4 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar10], pIVar4->type == kInt64))
           && (pIVar4[1]._vptr_InfoRecord == pp_Var3)) {
          bVar8 = true;
          highsLogUser(report_log_options,kError,
                       "checkInfo: Info %d (\"%s\") has the same value pointer as info %d (\"%s\")\n"
                       ,uVar11 & 0xffffffff,(pIVar2->name)._M_dataplus._M_p,uVar10 & 0xffffffff,
                       (pIVar4->name)._M_dataplus._M_p);
        }
      }
    }
    else if (HVar1 == kInt) {
      pIVar2 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar11];
      pp_Var3 = pIVar2[1]._vptr_InfoRecord;
      for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
        if (((uVar11 != uVar10) &&
            (pIVar4 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar10], pIVar4->type == kInt)) &&
           (pIVar4[1]._vptr_InfoRecord == pp_Var3)) {
          bVar8 = true;
          highsLogUser(report_log_options,kError,
                       "checkInfo: Info %d (\"%s\") has the same value pointer as info %d (\"%s\")\n"
                       ,uVar11 & 0xffffffff,(pIVar2->name)._M_dataplus._M_p,uVar10 & 0xffffffff,
                       (pIVar4->name)._M_dataplus._M_p);
        }
      }
    }
    else if (HVar1 == kDouble) {
      pIVar2 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar11];
      pp_Var3 = pIVar2[1]._vptr_InfoRecord;
      for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
        if (((uVar11 != uVar10) &&
            (pIVar4 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar10], pIVar4->type == kDouble))
           && (pIVar4[1]._vptr_InfoRecord == pp_Var3)) {
          bVar8 = true;
          highsLogUser(report_log_options,kError,
                       "checkInfo: Info %d (\"%s\") has the same value pointer as info %d (\"%s\")\n"
                       ,uVar11 & 0xffffffff,(pIVar2->name)._M_dataplus._M_p,uVar10 & 0xffffffff,
                       (pIVar4->name)._M_dataplus._M_p);
        }
      }
    }
    std::__cxx11::string::~string((string *)&name);
  }
  if (bVar8) {
    IVar9 = kIllegalValue;
  }
  else {
    IVar9 = kOk;
    highsLogUser(report_log_options,kInfo,"checkInfo: Info are OK\n");
  }
  return IVar9;
}

Assistant:

InfoStatus checkInfo(const HighsLogOptions& report_log_options,
                     const std::vector<InfoRecord*>& info_records) {
  bool error_found = false;
  HighsInt num_info = info_records.size();
  for (HighsInt index = 0; index < num_info; index++) {
    std::string name = info_records[index]->name;
    HighsInfoType type = info_records[index]->type;
    // Check that there are no other info with the same name
    for (HighsInt check_index = 0; check_index < num_info; check_index++) {
      if (check_index == index) continue;
      std::string check_name = info_records[check_index]->name;
      if (check_name == name) {
        highsLogUser(report_log_options, HighsLogType::kError,
                     "checkInfo: Info %" HIGHSINT_FORMAT
                     " (\"%s\") has the same name as info %" HIGHSINT_FORMAT
                     " \"%s\"\n",
                     index, name.c_str(), check_index, check_name.c_str());
        error_found = true;
      }
    }
    if (type == HighsInfoType::kInt64) {
      // Check int64_t info
      InfoRecordInt64& info = ((InfoRecordInt64*)info_records[index])[0];
      // Check that there are no other info with the same value pointers
      int64_t* value_pointer = info.value;
      for (HighsInt check_index = 0; check_index < num_info; check_index++) {
        if (check_index == index) continue;
        InfoRecordInt64& check_info =
            ((InfoRecordInt64*)info_records[check_index])[0];
        if (check_info.type == HighsInfoType::kInt64) {
          if (check_info.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkInfo: Info %" HIGHSINT_FORMAT
                         " (\"%s\") has the same value "
                         "pointer as info %" HIGHSINT_FORMAT " (\"%s\")\n",
                         index, info.name.c_str(), check_index,
                         check_info.name.c_str());
            error_found = true;
          }
        }
      }
    } else if (type == HighsInfoType::kInt) {
      // Check HighsInt info
      InfoRecordInt& info = ((InfoRecordInt*)info_records[index])[0];
      // Check that there are no other info with the same value pointers
      HighsInt* value_pointer = info.value;
      for (HighsInt check_index = 0; check_index < num_info; check_index++) {
        if (check_index == index) continue;
        InfoRecordInt& check_info =
            ((InfoRecordInt*)info_records[check_index])[0];
        if (check_info.type == HighsInfoType::kInt) {
          if (check_info.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkInfo: Info %" HIGHSINT_FORMAT
                         " (\"%s\") has the same value "
                         "pointer as info %" HIGHSINT_FORMAT " (\"%s\")\n",
                         index, info.name.c_str(), check_index,
                         check_info.name.c_str());
            error_found = true;
          }
        }
      }
    } else if (type == HighsInfoType::kDouble) {
      // Check double info
      InfoRecordDouble& info = ((InfoRecordDouble*)info_records[index])[0];
      // Check that there are no other info with the same value pointers
      double* value_pointer = info.value;
      for (HighsInt check_index = 0; check_index < num_info; check_index++) {
        if (check_index == index) continue;
        InfoRecordDouble& check_info =
            ((InfoRecordDouble*)info_records[check_index])[0];
        if (check_info.type == HighsInfoType::kDouble) {
          if (check_info.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkInfo: Info %" HIGHSINT_FORMAT
                         " (\"%s\") has the same value "
                         "pointer as info %" HIGHSINT_FORMAT " (\"%s\")\n",
                         index, info.name.c_str(), check_index,
                         check_info.name.c_str());
            error_found = true;
          }
        }
      }
    }
  }
  if (error_found) return InfoStatus::kIllegalValue;
  highsLogUser(report_log_options, HighsLogType::kInfo,
               "checkInfo: Info are OK\n");
  return InfoStatus::kOk;
}